

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x1_010.c
# Opt level: O3

void seta_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  DEV_SMPL *__s;
  DEV_SMPL *pDVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  char *pcVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  
  __s = *outputs;
  pDVar7 = outputs[1];
  uVar16 = (ulong)samples;
  lVar15 = 0;
  memset(__s,0,uVar16 * 4);
  memset(outputs[1],0,uVar16 * 4);
  do {
    bVar2 = *(byte *)((long)param + lVar15 * 8 + 0x1c);
    if (((bVar2 & 1) != 0) && (*(char *)((long)param + lVar15 + 0x20a0) == '\0')) {
      if ((bVar2 & 2) == 0) {
        bVar9 = *(byte *)((long)param + lVar15 * 8 + 0x1e) >> (bVar2 >> 7);
        if (bVar9 == 0) {
          bVar9 = 4;
        }
        auVar22._0_4_ = *(uint *)((long)param + lVar15 * 4 + 0x201c);
        auVar22._4_4_ = *(uint *)((long)param + 0x209c);
        uVar6 = *(uint *)((long)param + 0x18);
        if (samples != 0) {
          lVar8 = *(long *)((long)param + 0x10);
          bVar3 = *(byte *)((long)param + lVar15 * 8 + 0x20);
          bVar4 = *(byte *)((long)param + lVar15 * 8 + 0x21);
          bVar5 = *(byte *)((long)param + lVar15 * 8 + 0x1d);
          uVar12 = 0;
          do {
            pcVar11 = (char *)((ulong)(auVar22._0_4_ >> 0xe) + (ulong)bVar3 * 0x1000 + lVar8);
            if ((char *)(lVar8 + (ulong)bVar4 * -0x1000 + 0x100000) <= pcVar11) {
              *(byte *)((long)param + lVar15 * 8 + 0x1c) = bVar2 & 0xfe;
              break;
            }
            iVar10 = (int)*pcVar11;
            iVar13 = (uint)(bVar5 >> 4) * 0x222 * iVar10;
            iVar23 = iVar13 + 0xff;
            if (-1 < iVar13) {
              iVar23 = iVar13;
            }
            __s[uVar12] = __s[uVar12] + (iVar23 >> 8);
            iVar10 = iVar10 * (bVar5 & 0xf) * 0x222;
            iVar23 = iVar10 + 0xff;
            if (-1 < iVar10) {
              iVar23 = iVar10;
            }
            piVar1 = pDVar7 + uVar12;
            *piVar1 = *piVar1 + (iVar23 >> 8);
            auVar22._0_4_ =
                 auVar22._0_4_ +
                 (int)(long)(((float)bVar9 * (float)auVar22._4_4_ * 0.00012207031 * 16384.0) /
                             (float)uVar6 + 0.5);
            uVar12 = uVar12 + 1;
          } while (uVar16 != uVar12);
        }
        *(uint *)((long)param + lVar15 * 4 + 0x201c) = auVar22._0_4_;
      }
      else {
        auVar22._0_4_ = *(uint *)((long)param + lVar15 * 4 + 0x201c);
        auVar22._4_4_ = *(uint *)((long)param + lVar15 * 4 + 0x205c);
        dVar17 = (double)*(uint *)((long)param + 0x209c) * 0.0078125 * 0.0009765625 * 0.25;
        auVar20._0_8_ = (double)*(uint *)((long)param + 0x18);
        auVar18._0_8_ =
             dVar17 * (double)(*(ushort *)((long)param + lVar15 * 8 + 0x1e) >> (bVar2 >> 7)) *
             16384.0;
        auVar18._8_8_ = dVar17 * (double)*(byte *)((long)param + lVar15 * 8 + 0x20) * 65536.0;
        auVar20._8_8_ = auVar20._0_8_;
        auVar18 = divpd(auVar18,auVar20);
        dVar17 = auVar18._0_8_ + 0.5;
        dVar19 = auVar18._8_8_ + 0.5;
        if (samples != 0) {
          bVar9 = *(byte *)((long)param + lVar15 * 8 + 0x1d);
          bVar3 = *(byte *)((long)param + lVar15 * 8 + 0x21);
          iVar23 = (int)dVar17;
          iVar10 = (int)dVar19;
          uVar12 = CONCAT44((int)(dVar19 + -2147483648.0),(int)(dVar17 + -2147483648.0)) &
                   CONCAT44(iVar10 >> 0x1f,iVar23 >> 0x1f) | CONCAT44(iVar10,iVar23);
          auVar21._4_4_ = auVar22._4_4_;
          auVar21._0_4_ = auVar22._0_4_;
          auVar21._8_8_ = 0;
          uVar14 = 0;
          do {
            auVar22._0_4_ = auVar21._0_4_;
            auVar22._4_4_ = auVar21._4_4_;
            auVar22._12_4_ = auVar21._12_4_;
            if (((bVar2 & 4) != 0) && (0x7fffff < auVar22._4_4_)) {
              *(byte *)((long)param + lVar15 * 8 + 0x1c) = bVar2 & 0xfe;
              break;
            }
            bVar4 = *(byte *)((long)param +
                             (ulong)(auVar22._4_4_ >> 0x10 & 0x7f) + (ulong)bVar3 * 0x80 + 0x1c);
            iVar10 = *(char *)((long)param +
                              (ulong)(auVar22._0_4_ >> 0xe & 0x7f) + (ulong)bVar9 * 0x80 + 0x101c) *
                     0x222;
            iVar13 = (uint)(bVar4 >> 4) * iVar10;
            iVar23 = iVar13 + 0xff;
            if (-1 < iVar13) {
              iVar23 = iVar13;
            }
            __s[uVar14] = __s[uVar14] + (iVar23 >> 8);
            iVar10 = (bVar4 & 0xf) * iVar10;
            iVar23 = iVar10 + 0xff;
            if (-1 < iVar10) {
              iVar23 = iVar10;
            }
            piVar1 = pDVar7 + uVar14;
            *piVar1 = *piVar1 + (iVar23 >> 8);
            auVar22._0_4_ = auVar22._0_4_ + (int)uVar12;
            auVar22._4_4_ = auVar22._4_4_ + (int)(uVar12 >> 0x20);
            auVar22._8_4_ = auVar21._8_4_;
            uVar14 = uVar14 + 1;
            auVar21 = auVar22;
          } while (uVar16 != uVar14);
        }
        *(uint *)((long)param + lVar15 * 4 + 0x201c) = auVar22._0_4_;
        *(uint *)((long)param + lVar15 * 4 + 0x205c) = auVar22._4_4_;
      }
    }
    lVar15 = lVar15 + 1;
    if (lVar15 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

static void seta_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	x1_010_state *info = (x1_010_state *)param;
	X1_010_CHANNEL  *reg;
	UINT32  ch;
	UINT32  i;
	int     volL, volR, freq, div;
	INT8    *start, *end, data;
	UINT8   *env;
	UINT32  smp_offs, smp_step, env_offs, env_step, delta;
	DEV_SMPL *bufL = outputs[0];
	DEV_SMPL *bufR = outputs[1];

	// mixer buffer zero clear
	memset( outputs[0], 0, samples*sizeof(*outputs[0]) );
	memset( outputs[1], 0, samples*sizeof(*outputs[1]) );

//	if( info->sound_enable == 0 ) return;

	for( ch = 0; ch < SETA_NUM_CHANNELS; ch++ ) {
		reg = (X1_010_CHANNEL *)&(info->reg[ch*sizeof(X1_010_CHANNEL)]);
		if( (reg->status&1) != 0 && ! info->Muted[ch]) {        // Key On
			div = (reg->status&0x80) ? 1 : 0;
			if( (reg->status&2) == 0 ) {                        // PCM sampling
				start    = (INT8 *)(info->rom + reg->start*0x1000);
				end      = (INT8 *)(info->rom + (0x100-reg->end)*0x1000);
				volL     = ((reg->volume>>4)&0xf)*VOL_BASE;
				volR     = ((reg->volume>>0)&0xf)*VOL_BASE;
				smp_offs = info->smp_offset[ch];
				freq     = reg->frequency>>div;
				// Meta Fox does write the frequency register, but this is a hack to make it "work" with the current setup
				// This is broken for Arbalester (it writes 8), but that'll be fixed later.
				if( freq == 0 ) freq = 4;
				smp_step = (UINT32)((float)info->base_clock/8192.0f
							*freq*(1<<FREQ_BASE_BITS)/(float)info->rate+0.5f);
				if( smp_offs == 0 ) {
					LOG_SOUND(( "Play sample %p - %p, channel %X volume %d:%d freq %X step %X offset %X\n",
						start, end, ch, volL, volR, freq, smp_step, smp_offs ));
				}
				for( i = 0; i < samples; i++ ) {
					delta = smp_offs>>FREQ_BASE_BITS;
					// sample ended?
					if( start+delta >= end ) {
						reg->status &= ~0x01;                   // Key off
						break;
					}
					data = start[delta];
					bufL[i] += (data*volL/256);
					bufR[i] += (data*volR/256);
					smp_offs += smp_step;
				}
				info->smp_offset[ch] = smp_offs;
			} else {                                            // Wave form
				start    = (INT8 *)&(info->reg[reg->volume*128+0x1000]);
				smp_offs = info->smp_offset[ch];
				freq     = ((reg->pitch_hi<<8)+reg->frequency)>>div;
				smp_step = (UINT32)((float)info->base_clock/128.0/1024.0/4.0*freq*(1<<FREQ_BASE_BITS)/(float)info->rate+0.5f);

				env      = (UINT8 *)&(info->reg[reg->end*128]);
				env_offs = info->env_offset[ch];
				env_step = (UINT32)((float)info->base_clock/128.0/1024.0/4.0*reg->start*(1<<ENV_BASE_BITS)/(float)info->rate+0.5f);
				/* Print some more debug info */
				if( smp_offs == 0 ) {
					LOG_SOUND(( "Play waveform %X, channel %X volume %X freq %4X step %X offset %X\n",
						reg->volume, ch, reg->end, freq, smp_step, smp_offs ));
				}
				for( i = 0; i < samples; i++ ) {
					int vol;
					delta = env_offs>>ENV_BASE_BITS;
					// Envelope one shot mode
					if( (reg->status&4) != 0 && delta >= 0x80 ) {
						reg->status &= ~0x01;                   // Key off
						break;
					}
					vol = env[delta&0x7f];
					volL = ((vol>>4)&0xf)*VOL_BASE;
					volR = ((vol>>0)&0xf)*VOL_BASE;
					data  = start[(smp_offs>>FREQ_BASE_BITS)&0x7f];
					bufL[i] += (data*volL/256);
					bufR[i] += (data*volR/256);
					smp_offs += smp_step;
					env_offs += env_step;
				}
				info->smp_offset[ch] = smp_offs;
				info->env_offset[ch] = env_offs;
			}
		}
	}
}